

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O0

void __thiscall
CGL::Camera::analyze_world_coord(Camera *this,Vector3D *pos_world,double *ns_x,double *ns_y)

{
  ostream *poVar1;
  void *this_00;
  double *in_RCX;
  double *in_RDX;
  Vector3D *in_RDI;
  double dVar2;
  double dVar3;
  Vector3D pos_image;
  Vector3D pos_camera;
  double edge_y;
  double edge_x;
  double vFOV_rads;
  double hFOV_rads;
  ostream *in_stack_fffffffffffffef0;
  Vector3D *in_stack_fffffffffffffef8;
  double local_100;
  Matrix3x3 *in_stack_ffffffffffffff08;
  Vector3D *in_stack_ffffffffffffff80;
  Matrix3x3 *in_stack_ffffffffffffff88;
  ostream *local_58;
  
  dVar3 = in_RDI[5].field_0.field_0.x;
  dVar2 = tan(*(double *)((long)&in_RDI[4].field_0 + 0x18) * 0.017453292519943295 * 0.5);
  dVar3 = tan(dVar3 * 0.017453292519943295 * 0.5);
  Matrix3x3::T(in_stack_ffffffffffffff08);
  Vector3D::operator-((Vector3D *)in_stack_fffffffffffffef0,in_RDI);
  Matrix3x3::operator*(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  std::operator<<((ostream *)&std::cout,"position of coord in camera: ");
  poVar1 = operator<<(in_stack_fffffffffffffef0,in_RDI);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::abs((int)poVar1);
  Vector3D::operator/(in_stack_fffffffffffffef8,(double *)local_58);
  std::operator<<((ostream *)&std::cout,"position of coord on image plane in camera: ");
  poVar1 = operator<<(local_58,in_RDI);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"camera image plane edges x,y: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar2);
  poVar1 = std::operator<<(poVar1,", ");
  this_00 = (void *)std::ostream::operator<<(poVar1,dVar3);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  *in_RDX = ((double)in_stack_fffffffffffffef8 / dVar2 + 1.0) / 2.0;
  *in_RCX = (local_100 / dVar3 + 1.0) / 2.0;
  poVar1 = std::operator<<((ostream *)&std::cout,"normalized screen space coords: (x,y) = (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*in_RDX);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*in_RCX);
  std::operator<<(poVar1,")\n");
  return;
}

Assistant:

void Camera::analyze_world_coord(Vector3D& pos_world, double& ns_x, double& ns_y) {
  double hFOV_rads = this->hFov * (PI / 180.0); // x
  double vFOV_rads = this->vFov * (PI / 180.0); // y

  double edge_x = tan(0.5 * hFOV_rads); //
  double edge_y = tan(0.5 * vFOV_rads);

  Vector3D pos_camera = c2w.T() * (pos_world - pos);
  cout << "position of coord in camera: " << pos_camera << endl;

  Vector3D pos_image = pos_camera / abs(pos_camera.z);
  cout << "position of coord on image plane in camera: " << pos_image << endl;

  cout << "camera image plane edges x,y: " << edge_x << ", " << edge_y << endl;

//  double camera_space_x = edge_x * (2 * x - 1);
//  double camera_space_y = edge_y * (2 * y - 1);
  /*
   * (csx / ex) = 2x - 1
   * (csx/ex) + 1 = 2x
   * x = ((csx/ex)+1)/2
   */

  // Normalized Screen Coords
  ns_x = ((pos_image.x / edge_x)+1)/2.0;
  ns_y = ((pos_image.y / edge_y)+1)/2.0;

  cout << "normalized screen space coords: (x,y) = (" << ns_x << ", " << ns_y << ")\n";
}